

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::Test::RecordProperty(string *key,int value)

{
  stringstream *this;
  allocator local_61;
  string local_60;
  string local_40;
  
  this = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this);
  *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
  std::ostream::operator<<((ostream *)(this + 0x10),value);
  internal::StringStreamToString(&local_60,(stringstream *)this);
  std::__cxx11::string::string((string *)&local_40,local_60._M_dataplus._M_p,&local_61);
  UnitTest::GetInstance();
  UnitTest::RecordProperty(&UnitTest::GetInstance::instance,key,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (**(code **)(*(long *)this + 8))(this);
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}